

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O2

void PatchAlterNigelColors::fix_sword_shade(ROM *rom)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  allocator_type local_3f9;
  Sprite nigel_frame_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  Sprite nigel_frame_62;
  Sprite nigel_frame_32;
  Sprite nigel_frame_23;
  Sprite nigel_frame_39;
  Sprite nigel_frame_37;
  Sprite nigel_frame_36;
  Sprite nigel_frame_35;
  Sprite nigel_frame_33;
  Sprite nigel_frame_18;
  Sprite nigel_frame_16;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  Sprite nigel_frame_10;
  
  fix_sword_shade_frame(rom,0x1220ae,'\v');
  fix_sword_shade_frame(rom,0x122a7c,'\v');
  fix_sword_shade_frame(rom,0x122d1a,'\v');
  fix_sword_shade_frame(rom,0x122f62,'\v');
  fix_sword_shade_frame(rom,0x1231a0,'\v');
  Sprite::decode_from(&nigel_frame_10,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x1233a8);
  Sprite::replace_color_in_tile(&nigel_frame_10,'\t','\x06','\v');
  Sprite::set_pixel(&nigel_frame_10,'\n','\a','\x06','\x06');
  Sprite::set_pixel(&nigel_frame_10,'\n','\x06','\a','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_16,&nigel_frame_10);
  local_68._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_16._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_16._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_16._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_16._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_16._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_16._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1233a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68
                    );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_16);
  fix_sword_shade_frame(rom,0x123626,'\v');
  fix_sword_shade_frame(rom,0x123fa8,'\v');
  Sprite::decode_from(&nigel_frame_16,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x124200);
  Sprite::replace_color_in_tile(&nigel_frame_16,'\t','\x06','\v');
  Sprite::set_pixel(&nigel_frame_16,'\v','\0','\x02','\t');
  Sprite::encode((ByteArray *)&nigel_frame_18,&nigel_frame_16);
  local_88._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_18._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_18._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_18._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_18._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_18._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_18._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x124200,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88
                    );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_18);
  Sprite::decode_from(&nigel_frame_18,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x124694);
  Sprite::replace_color_in_tile(&nigel_frame_18,'\t','\x06','\x06');
  Sprite::set_pixel(&nigel_frame_18,'\n','\x03','\a','\x06');
  Sprite::replace_color_in_tile(&nigel_frame_18,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&nigel_frame_23,&nigel_frame_18);
  local_a8._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_23._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a8._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_23._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_23._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_23._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_23._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_23._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x124694,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8
                    );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_23);
  fix_sword_shade_frame(rom,0x12493c,'\v');
  fix_sword_shade_frame(rom,0x124be2,'\v');
  fix_sword_shade_frame(rom,0x12510a,'\x0f');
  Sprite::decode_from(&nigel_frame_23,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x125370);
  Sprite::set_pixel(&nigel_frame_23,'\x0f','\x05','\0','\x06');
  Sprite::set_pixel(&nigel_frame_23,'\x0f','\x05','\x01','\x06');
  Sprite::set_pixel(&nigel_frame_23,'\x0f','\x06','\x01','\x06');
  Sprite::set_pixel(&nigel_frame_23,'\x0f','\x06','\x02','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_32,&nigel_frame_23);
  local_c8._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_32._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_32._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_32._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_32._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_32._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_32._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x125370,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8
                    );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_32);
  fix_sword_shade_frame(rom,0x125616,'\v');
  nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(nigel_frame_33._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l._M_len = 2;
  __l._M_array = (iterator)&nigel_frame_33;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nigel_frame_32._data,__l,(allocator_type *)&nigel_frame_35);
  fix_sword_shade_frame(rom,0x1258c2,&nigel_frame_32._data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_32);
  fix_sword_shade_frame(rom,0x125b70,'\v');
  fix_sword_shade_frame(rom,0x125e24,'\v');
  fix_sword_shade_frame(rom,0x1260da,'\v');
  fix_sword_shade_frame(rom,0x126374,'\v');
  fix_sword_shade_frame(rom,0x1265e8,'\v');
  fix_sword_shade_frame(rom,0x126866,'\v');
  Sprite::decode_from(&nigel_frame_32,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x126ac4);
  Sprite::set_pixel(&nigel_frame_32,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&nigel_frame_32,'\v','\x05','\0','\x06');
  Sprite::set_pixel(&nigel_frame_32,'\v','\x04','\x01','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_33,&nigel_frame_32);
  local_e8._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_e8._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_33._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x126ac4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8
                    );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_33);
  Sprite::decode_from(&nigel_frame_33,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x126d66);
  Sprite::set_pixel(&nigel_frame_33,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&nigel_frame_33,'\v','\x05','\0','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_35,&nigel_frame_33);
  local_108._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_35._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_35._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_35._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_35._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_35._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_35._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x126d66,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_35);
  fix_sword_shade_frame(rom,0x12700c,'\v');
  Sprite::decode_from(&nigel_frame_35,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x1272ac);
  Sprite::set_pixel(&nigel_frame_35,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile(&nigel_frame_35,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&nigel_frame_36,&nigel_frame_35);
  local_128._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_36._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_128._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_36._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_36._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_36._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_36._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_36._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1272ac,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_36);
  Sprite::decode_from(&nigel_frame_36,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x127546);
  Sprite::set_pixel(&nigel_frame_36,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&nigel_frame_36,'\v','\x05','\0','\x06');
  Sprite::set_pixel(&nigel_frame_36,'\v','\x04','\x01','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_37,&nigel_frame_36);
  local_148._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_37._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_148._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_37._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_37._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_37._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_37._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_37._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x127546,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_148);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_37);
  Sprite::decode_from(&nigel_frame_37,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x1277d0);
  Sprite::set_pixel(&nigel_frame_37,'\n','\x05','\a','\x06');
  Sprite::set_pixel(&nigel_frame_37,'\n','\x06','\x06','\x06');
  Sprite::set_pixel(&nigel_frame_37,'\v','\x04','\0','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_39,&nigel_frame_37);
  local_168._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_39._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_39._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_39._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_39._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_39._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_39._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1277d0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_39);
  fix_sword_shade_frame(rom,0x127a50,'\v');
  Sprite::decode_from(&nigel_frame_39,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x127cc8);
  Sprite::set_pixel(&nigel_frame_39,'\v','\x06','\x01','\x06');
  Sprite::set_pixel(&nigel_frame_39,'\v','\x05','\x02','\x06');
  Sprite::set_pixel(&nigel_frame_39,'\v','\x04','\x03','\x06');
  Sprite::encode((ByteArray *)&nigel_frame_60,&nigel_frame_39);
  local_188._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_60._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_188._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_60._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_60._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_60._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_60._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_60._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x127cc8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_188);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_60);
  fix_sword_shade_frame(rom,0x127f28,'\n');
  fix_sword_shade_frame(rom,0x128126,'\n');
  fix_sword_shade_frame(rom,0x128340,'\n');
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(nigel_frame_62._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&nigel_frame_62;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nigel_frame_60._data,__l_00,(allocator_type *)&local_3c8);
  fix_sword_shade_frame(rom,0x12859a,&nigel_frame_60._data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_60);
  fix_sword_shade_frame(rom,0x1287fa,'\n');
  fix_sword_shade_frame(rom,0x128a10,'\n');
  fix_sword_shade_frame(rom,0x128c36,'\n');
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(nigel_frame_62._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&nigel_frame_62;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nigel_frame_60._data,__l_01,(allocator_type *)&local_3c8);
  fix_sword_shade_frame(rom,0x128e6c,&nigel_frame_60._data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_60);
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT53(nigel_frame_62._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._3_5_,0xf0e0a);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&nigel_frame_62;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nigel_frame_60._data,__l_02,(allocator_type *)&local_3c8);
  fix_sword_shade_frame(rom,0x1290c4,&nigel_frame_60._data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_60);
  fix_sword_shade_frame(rom,0x129324,'\n');
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT53(nigel_frame_62._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._3_5_,0xb0a06);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&nigel_frame_62;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nigel_frame_60._data,__l_03,(allocator_type *)&local_3c8);
  fix_sword_shade_frame(rom,0x1295d2,&nigel_frame_60._data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_60);
  Sprite::decode_from(&nigel_frame_60,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x12b990);
  Sprite::set_pixel(&nigel_frame_60,'\n','\x01','\a','\x06');
  Sprite::set_pixel(&nigel_frame_60,'\n','\x05','\a','\x06');
  Sprite::set_pixel(&nigel_frame_60,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile(&nigel_frame_60,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&nigel_frame_62,&nigel_frame_60);
  local_1a8._M_impl.super__Vector_impl_data._M_start =
       nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._M_impl.super__Vector_impl_data._M_finish =
       nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage =
       nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nigel_frame_62._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x12b990,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_62);
  local_3c8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_3c8._M_impl.super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_3c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nigel_frame_62._data,__l_04,&local_3f9);
  fix_sword_shade_frame(rom,0x12bb9e,&nigel_frame_62._data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nigel_frame_62);
  Sprite::decode_from(&nigel_frame_62,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x12bdfe);
  Sprite::set_pixel(&nigel_frame_62,'\n','\x02','\a','\x06');
  Sprite::replace_color_in_tile(&nigel_frame_62,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_3c8,&nigel_frame_62);
  local_1c8._M_impl.super__Vector_impl_data._M_start =
       local_3c8._M_impl.super__Vector_impl_data._M_start;
  local_1c8._M_impl.super__Vector_impl_data._M_finish =
       local_3c8._M_impl.super__Vector_impl_data._M_finish;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_3c8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x12bdfe,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3c8);
  Sprite::~Sprite(&nigel_frame_62);
  Sprite::~Sprite(&nigel_frame_60);
  Sprite::~Sprite(&nigel_frame_39);
  Sprite::~Sprite(&nigel_frame_37);
  Sprite::~Sprite(&nigel_frame_36);
  Sprite::~Sprite(&nigel_frame_35);
  Sprite::~Sprite(&nigel_frame_33);
  Sprite::~Sprite(&nigel_frame_32);
  Sprite::~Sprite(&nigel_frame_23);
  Sprite::~Sprite(&nigel_frame_18);
  Sprite::~Sprite(&nigel_frame_16);
  Sprite::~Sprite(&nigel_frame_10);
  return;
}

Assistant:

static void fix_sword_shade(md::ROM& rom)
    {
        fix_sword_shade_frame(rom, 0x1220AE, 11); // SpriteGfx000Frame02
        fix_sword_shade_frame(rom, 0x122A7C, 11); // SpriteGfx000Frame06
        fix_sword_shade_frame(rom, 0x122D1A, 11); // SpriteGfx000Frame07
        fix_sword_shade_frame(rom, 0x122F62, 11); // SpriteGfx000Frame08
        fix_sword_shade_frame(rom, 0x1231A0, 11); // SpriteGfx000Frame09

        Sprite nigel_frame_10 = Sprite::decode_from(rom.iterator_at(0x1233A8));
        nigel_frame_10.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_10.set_pixel(10, 7, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_10.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1233A8, nigel_frame_10.encode());

        fix_sword_shade_frame(rom, 0x123626, 11); // SpriteGfx000Frame11
        fix_sword_shade_frame(rom, 0x123FA8, 11); // SpriteGfx000Frame15

        Sprite nigel_frame_16 = Sprite::decode_from(rom.iterator_at(0x124200));
        nigel_frame_16.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_16.set_pixel(11, 0, 2, COLOR_SWORD_WRONG);
        rom.set_bytes(0x124200, nigel_frame_16.encode());

        Sprite nigel_frame_18 = Sprite::decode_from(rom.iterator_at(0x124694));
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 6);
        nigel_frame_18.set_pixel(10, 3, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x124694, nigel_frame_18.encode());

        fix_sword_shade_frame(rom, 0x12493C, 11); // SpriteGfx000Frame19
        fix_sword_shade_frame(rom, 0x124BE2, 11); // SpriteGfx000Frame20

        // --- Anim dropping held item, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x12510A, 15); // SpriteGfx000Frame22

        Sprite nigel_frame_23 = Sprite::decode_from(rom.iterator_at(0x125370));
        nigel_frame_23.set_pixel(15, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 5, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 2, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x125370, nigel_frame_23.encode());

        // --- Anim held item, not looking camera ----------------------------
        fix_sword_shade_frame(rom, 0x125616, 11); // SpriteGfx000Frame24
        fix_sword_shade_frame(rom, 0x1258C2, {10, 11}); // SpriteGfx000Frame25
        fix_sword_shade_frame(rom, 0x125B70, 11); // SpriteGfx000Frame26
        fix_sword_shade_frame(rom, 0x125E24, 11); // SpriteGfx000Frame27
        fix_sword_shade_frame(rom, 0x1260DA, 11); // SpriteGfx000Frame28
        fix_sword_shade_frame(rom, 0x126374, 11); // SpriteGfx000Frame29
        fix_sword_shade_frame(rom, 0x1265E8, 11); // SpriteGfx000Frame30
        fix_sword_shade_frame(rom, 0x126866, 11); // SpriteGfx000Frame31

        // --- Anim held item, facing camera ----------------------------
        Sprite nigel_frame_32 = Sprite::decode_from(rom.iterator_at(0x126AC4));
        nigel_frame_32.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126AC4, nigel_frame_32.encode());

        Sprite nigel_frame_33 = Sprite::decode_from(rom.iterator_at(0x126D66));
        nigel_frame_33.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_33.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126D66, nigel_frame_33.encode());

        fix_sword_shade_frame(rom, 0x12700C, 11); // SpriteGfx000Frame34

        Sprite nigel_frame_35 = Sprite::decode_from(rom.iterator_at(0x1272AC));
        nigel_frame_35.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_35.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x1272AC, nigel_frame_35.encode());

        Sprite nigel_frame_36 = Sprite::decode_from(rom.iterator_at(0x127546));
        nigel_frame_36.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127546, nigel_frame_36.encode());

        Sprite nigel_frame_37 = Sprite::decode_from(rom.iterator_at(0x1277D0));
        nigel_frame_37.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(10, 6, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(11, 4, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1277D0, nigel_frame_37.encode());

        fix_sword_shade_frame(rom, 0x127A50, 11); // SpriteGfx000Frame38

        Sprite nigel_frame_39 = Sprite::decode_from(rom.iterator_at(0x127CC8));
        nigel_frame_39.set_pixel(11, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 5, 2, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 4, 3, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127CC8, nigel_frame_39.encode());

        // --- Anim jumping, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x127F28, 10); // SpriteGfx000Frame40
        fix_sword_shade_frame(rom, 0x128126, 10); // SpriteGfx000Frame41

        // --- Anim jumping, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128340, 10); // SpriteGfx000Frame42
        fix_sword_shade_frame(rom, 0x12859A, {10, 11}); // SpriteGfx000Frame43

        // --- Anim jumping holding something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1287FA, 10); // SpriteGfx000Frame44
        fix_sword_shade_frame(rom, 0x128A10, 10); // SpriteGfx000Frame45

        // --- Anim jumping holding something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128C36, 10); // SpriteGfx000Frame46
        fix_sword_shade_frame(rom, 0x128E6C, {10, 11}); // SpriteGfx000Frame47

        // --- Anim jumping throwing something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1290C4, {10, 14, 15}); // SpriteGfx000Frame48
        fix_sword_shade_frame(rom, 0x129324, 10); // SpriteGfx000Frame49

        // --- Anim jumping throwing something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x1295D2, {6, 10, 11}); // SpriteGfx000Frame50

        // --- Anim climbing, not looking at camera ----------------------------
        Sprite nigel_frame_60 = Sprite::decode_from(rom.iterator_at(0x12B990));
        nigel_frame_60.set_pixel(10, 1, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12B990, nigel_frame_60.encode());

        fix_sword_shade_frame(rom, 0x12BB9E, {10, 11}); // SpriteGfx000Frame61

        Sprite nigel_frame_62 = Sprite::decode_from(rom.iterator_at(0x12BDFE));
        nigel_frame_62.set_pixel(10, 2, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_62.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12BDFE, nigel_frame_62.encode());
    }